

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
                   (TestResult *result)

{
  int iVar1;
  int iVar2;
  string *in_RDI;
  TestProperty *property;
  int i;
  Message attributes;
  string *in_stack_ffffffffffffff18;
  allocator *in_stack_ffffffffffffff20;
  Message *in_stack_ffffffffffffff28;
  TestResult *in_stack_ffffffffffffff30;
  Message *in_stack_ffffffffffffff50;
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  char *local_40;
  TestProperty *local_28;
  int local_1c;
  
  Message::Message(in_stack_ffffffffffffff50);
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = TestResult::test_property_count((TestResult *)0x1a32c4);
    if (iVar2 <= iVar1) break;
    local_28 = TestResult::GetTestProperty
                         (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20))
    ;
    Message::operator<<((Message *)in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18
                       );
    local_40 = TestProperty::key((TestProperty *)0x1a3322);
    Message::operator<<((Message *)in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18);
    Message::operator<<((Message *)in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18
                       );
    in_stack_ffffffffffffff30 =
         (TestResult *)
         Message::operator<<((Message *)in_stack_ffffffffffffff20,
                             (char (*) [2])in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff28 = (Message *)TestProperty::value((TestProperty *)0x1a338c);
    in_stack_ffffffffffffff20 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    EscapeXmlAttribute(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff18 =
         (string *)
         Message::operator<<((Message *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    Message::operator<<((Message *)in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18
                       );
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_1c = local_1c + 1;
  }
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffff28);
  Message::~Message((Message *)0x1a34ca);
  return in_RDI;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}